

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpnghandler.cpp
# Opt level: O3

void iod_read_fn(png_structp png_ptr,png_bytep data,png_size_t length)

{
  png_struct **pppVar1;
  png_info **pppVar2;
  float fVar3;
  float fVar4;
  png_struct *ppVar5;
  png_info *ppVar6;
  QString *pQVar7;
  Representation RVar8;
  Representation RVar9;
  char cVar10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  Format FVar15;
  long lVar16;
  QIODevice *pQVar17;
  long lVar18;
  __jmp_buf_tag *__env;
  ulong uVar19;
  uchar *puVar20;
  qsizetype qVar21;
  png_byte **pppVar22;
  uchar *puVar23;
  QRgb c;
  ulong uVar24;
  byte *pbVar25;
  char *image;
  byte *pbVar26;
  QPngHandlerPrivate *this;
  QSize size;
  QSize size_00;
  int iVar27;
  QSize size_01;
  QSize size_02;
  QSize size_03;
  QSize size_04;
  long in_FS_OFFSET;
  undefined1 auVar28 [16];
  int iStack_94;
  ulong uStack_90;
  int iStack_84;
  ulong uStack_80;
  QPoint QStack_78;
  uint uStack_70;
  int iStack_6c;
  Representation RStack_68;
  Representation RStack_64;
  long lStack_60;
  png_structp ppStack_58;
  QIODevice *pQStack_50;
  long lStack_48;
  png_bytep ppStack_40;
  png_size_t pStack_38;
  
  lVar16 = png_get_io_ptr();
  pQVar17 = QImageIOHandler::device(*(QImageIOHandler **)(lVar16 + 0x78));
  if (((*(int *)(lVar16 + 0x70) == 2) &&
      (cVar10 = (**(code **)(*(long *)pQVar17 + 0x60))(pQVar17), cVar10 == '\0')) &&
     (lVar18 = (**(code **)(*(long *)pQVar17 + 0x80))(pQVar17), 0 < lVar18)) {
    lVar16 = (**(code **)(*(long *)pQVar17 + 0x80))(pQVar17);
    lVar18 = (**(code **)(*(long *)pQVar17 + 0x78))(pQVar17);
    if ((length == 4) && (lVar16 = lVar16 - lVar18, lVar16 < 4)) {
      data[0] = 0xae;
      data[1] = 'B';
      data[2] = '`';
      data[3] = 0x82;
      auVar28 = (**(code **)(*(long *)pQVar17 + 0x80))(pQVar17);
      (**(code **)(*(long *)pQVar17 + 0x88))
                (pQVar17,auVar28._0_8_,auVar28._8_8_,*(code **)(*(long *)pQVar17 + 0x88));
      return;
    }
  }
  if (length == 0) {
    return;
  }
  while (uVar12 = QIODevice::read((char *)pQVar17,(longlong)data), 0 < (int)uVar12) {
    length = length - (uVar12 & 0x7fffffff);
    if (length == 0) {
      return;
    }
  }
  image = "Read Error";
  this = (QPngHandlerPrivate *)png_ptr;
  png_error();
  lStack_60 = *(long *)(in_FS_OFFSET + 0x28);
  ppStack_58 = png_ptr;
  pQStack_50 = pQVar17;
  lStack_48 = lVar16;
  ppStack_40 = data;
  pStack_38 = length;
  if (this->state == Error) goto LAB_005a43e8;
  if ((this->state != Ready) || (bVar11 = QPngHandlerPrivate::readPngHeader(this), bVar11)) {
    this->row_pointers = (png_byte **)0x0;
    pppVar1 = &this->png_ptr;
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(this->png_ptr,__longjmp_chk,200);
    iVar13 = _setjmp(__env);
    if (iVar13 == 0) {
      fVar3 = this->gamma;
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        fVar4 = this->fileGamma;
        if ((fVar4 != 0.0) || (NAN(fVar4))) {
          png_set_gamma(SUB84((double)(1.0 / fVar3),0),(double)fVar4,this->png_ptr);
          QColorSpace::setTransferFunction(&this->colorSpace,Gamma,1.0 / this->gamma);
          this->colorSpaceState = GammaChrm;
        }
      }
      ppVar5 = this->png_ptr;
      ppVar6 = this->info_ptr;
      pppVar2 = &this->info_ptr;
      RStack_64.m_i = 0;
      RStack_68.m_i = 0;
      iStack_6c = 0;
      uStack_70 = 0;
      QStack_78.xp.m_i = 0;
      QStack_78.yp.m_i = 0;
      uStack_80 = 0;
      iStack_84 = -0x55555556;
      uStack_90 = 0;
      iStack_94 = -0x55555556;
      png_get_IHDR(ppVar5,ppVar6,&RStack_64,&RStack_68,&iStack_6c,&uStack_70,0,0,0);
      RVar9.m_i = RStack_64.m_i;
      RVar8.m_i = RStack_68.m_i;
      png_set_interlace_handling(ppVar5);
      if (uStack_70 != 3) {
        if (uStack_70 == 0) {
          if ((iStack_6c == 1) && (cVar10 = png_get_channels(ppVar5,ppVar6), cVar10 == '\x01')) {
            png_set_invert_mono(ppVar5);
            png_read_update_info(ppVar5,ppVar6);
            size_01.ht.m_i = RVar8.m_i;
            size_01.wd.m_i = RVar9.m_i;
            bVar11 = QImageIOHandler::allocateImage(size_01,Format_Mono,(QImage *)image);
            if (!bVar11) goto LAB_005a43c4;
            QImage::setColorCount((QImage *)image,2);
            QImage::setColor((QImage *)image,1,0xff000000);
            QImage::setColor((QImage *)image,0,0xffffffff);
            iVar13 = png_get_tRNS(ppVar5,ppVar6,&QStack_78,&iStack_84,&uStack_80);
            if (uStack_80 != 0 && iVar13 != 0) {
              if (*(short *)(uStack_80 + 8) == 1) {
                uVar12 = 0;
                c = 0xffffff;
              }
              else {
                if (*(short *)(uStack_80 + 8) != 0) goto LAB_005a4499;
                uVar12 = 1;
LAB_005a4338:
                c = 0;
              }
              QImage::setColor((QImage *)image,uVar12,c);
            }
          }
          else {
            if (((iStack_6c == 0x10) && (cVar10 = png_get_channels(ppVar5,ppVar6), cVar10 == '\x01')
                ) && (iVar13 = png_get_valid(ppVar5,ppVar6,0x10), iVar13 == 0)) {
              FVar15 = Format_Grayscale16;
            }
            else {
              if (iStack_6c == 8) {
                iVar13 = png_get_valid(ppVar5,ppVar6,0x10);
                if (iVar13 != 0) goto LAB_005a4237;
                png_set_expand(ppVar5);
                size_04.ht.m_i = RVar8.m_i;
                size_04.wd.m_i = RVar9.m_i;
                bVar11 = QImageIOHandler::allocateImage(size_04,Format_Grayscale8,(QImage *)image);
                if (!bVar11) goto LAB_005a43c4;
                goto LAB_005a41a1;
              }
              if (iStack_6c != 0x10) {
LAB_005a4237:
                if (iStack_6c < 8) {
                  png_set_packing(ppVar5);
                }
                iVar13 = 0x100;
                if (iStack_6c < 8) {
                  iVar13 = 1 << ((byte)iStack_6c & 0x1f);
                }
                png_read_update_info(ppVar5,ppVar6);
                size_03.ht.m_i = RVar8.m_i;
                size_03.wd.m_i = RVar9.m_i;
                bVar11 = QImageIOHandler::allocateImage(size_03,Format_Indexed8,(QImage *)image);
                if (!bVar11) goto LAB_005a43c4;
                QImage::setColorCount((QImage *)image,iVar13);
                if (0 < iVar13) {
                  iVar27 = 0;
                  iVar14 = 0;
                  do {
                    uVar12 = iVar27 / (iVar13 + -1);
                    QImage::setColor((QImage *)image,iVar14,
                                     (uVar12 & 0xff) << 8 | uVar12 << 0x10 | uVar12 & 0xff |
                                     0xff000000);
                    iVar14 = iVar14 + 1;
                    iVar27 = iVar27 + 0xff;
                  } while (iVar13 != iVar14);
                }
                iVar14 = png_get_tRNS(ppVar5,ppVar6,&QStack_78,&iStack_84,&uStack_80);
                if ((iVar14 != 0 && uStack_80 != 0) &&
                   (uVar12 = (uint)*(ushort *)(uStack_80 + 8),
                   (int)(uint)*(ushort *)(uStack_80 + 8) < iVar13)) goto LAB_005a4338;
                goto LAB_005a4499;
              }
              iVar13 = png_get_valid(ppVar5,ppVar6,0x10);
              if (iVar13 == 0) {
                png_set_filler(ppVar5,0xffff,1);
                FVar15 = Format_RGBX64;
              }
              else {
                png_set_expand();
                FVar15 = Format_RGBA64;
              }
LAB_005a4353:
              png_set_gray_to_rgb(ppVar5);
            }
LAB_005a4369:
            size_00.ht.m_i = RVar8.m_i;
            size_00.wd.m_i = RVar9.m_i;
            bVar11 = QImageIOHandler::allocateImage(size_00,FVar15,(QImage *)image);
            if (!bVar11) goto LAB_005a43c4;
            png_read_update_info(ppVar5,ppVar6);
            png_set_swap(ppVar5);
          }
        }
        else {
LAB_005a40c9:
          if (iStack_6c == 0x10) {
            if ((uStack_70 & 1) == 0) {
              FVar15 = Format_RGBA64;
              if (((uStack_70 & 4) == 0) &&
                 (iVar13 = png_get_valid(ppVar5,ppVar6,0x10), iVar13 == 0)) {
                png_set_filler(ppVar5,0xffff,1);
                FVar15 = Format_RGBX64;
              }
              if ((uStack_70 & 2) == 0) goto LAB_005a4353;
              goto LAB_005a4369;
            }
            png_set_strip_16(ppVar5);
          }
          png_set_expand(ppVar5);
          if (uStack_70 == 4) {
            png_set_gray_to_rgb(ppVar5);
          }
          if ((uStack_70 & 4) == 0) {
            iVar13 = png_get_valid(ppVar5,ppVar6,0x10);
            FVar15 = Format_ARGB32;
            if (iVar13 == 0) {
              png_set_filler(ppVar5,0xff,1);
              FVar15 = Format_RGB32;
            }
          }
          else {
            FVar15 = Format_ARGB32;
          }
          size_02.ht.m_i = RVar8.m_i;
          size_02.wd.m_i = RVar9.m_i;
          bVar11 = QImageIOHandler::allocateImage(size_02,FVar15,(QImage *)image);
          if (!bVar11) goto LAB_005a43c4;
          png_set_bgr(ppVar5);
LAB_005a41a1:
          png_read_update_info(ppVar5,ppVar6);
        }
LAB_005a4499:
        uStack_80 = uStack_80 & 0xffffffff00000000;
        uStack_90 = uStack_90 & 0xffffffff00000000;
        RStack_64.m_i = 0;
        RStack_68.m_i = 0;
        iStack_6c = 0;
        uStack_70 = 0;
        iStack_84 = 0;
        png_get_IHDR(this->png_ptr,this->info_ptr,&uStack_80,&uStack_90,&iStack_6c,&uStack_70,0,0,0)
        ;
        png_get_oFFs(this->png_ptr,this->info_ptr,&RStack_64,&RStack_68,&iStack_84);
        puVar20 = QImage::bits((QImage *)image);
        qVar21 = QImage::bytesPerLine((QImage *)image);
        uVar19 = uStack_90 & 0xffffffff;
        pppVar22 = (png_byte **)operator_new__(uVar19 * 8);
        this->row_pointers = pppVar22;
        if (uVar19 != 0) {
          uVar24 = 0;
          puVar23 = puVar20;
          do {
            this->row_pointers[uVar24] = puVar23;
            uVar24 = uVar24 + 1;
            puVar23 = puVar23 + qVar21;
          } while (uVar19 != uVar24);
          pppVar22 = this->row_pointers;
        }
        png_read_image(*pppVar1,pppVar22);
        iVar13 = png_get_x_pixels_per_meter(*pppVar1,*pppVar2);
        QImage::setDotsPerMeterX((QImage *)image,iVar13);
        iVar13 = png_get_y_pixels_per_meter(*pppVar1,*pppVar2);
        QImage::setDotsPerMeterY((QImage *)image,iVar13);
        if (iStack_84 == 0) {
          QStack_78.yp.m_i = RStack_68.m_i;
          QStack_78.xp.m_i = RStack_64.m_i;
          QImage::setOffset((QImage *)image,&QStack_78);
        }
        if ((uStack_70 == 3) &&
           (FVar15 = QImage::format((QImage *)image), FVar15 == Format_Indexed8)) {
          iVar13 = QImage::colorCount((QImage *)image);
          if (0 < (int)uStack_90) {
            lVar16 = 0;
            do {
              if ((uStack_80 & 0xffffffff) != 0) {
                pbVar26 = puVar20 + qVar21 * lVar16;
                pbVar25 = pbVar26 + (uStack_80 & 0xffffffff);
                do {
                  if (iVar13 <= (int)(uint)*pbVar26) {
                    *pbVar26 = 0;
                  }
                  pbVar26 = pbVar26 + 1;
                } while (pbVar26 < pbVar25);
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 < (int)uStack_90);
          }
        }
        this->state = ReadingEnd;
        png_read_end(this->png_ptr,this->end_info);
        QPngHandlerPrivate::readPngTexts(this,this->end_info);
        if (1 < (ulong)(this->readTexts).d.size) {
          lVar18 = 0;
          lVar16 = lVar18;
          do {
            pQVar7 = (this->readTexts).d.ptr;
            QImage::setText((QImage *)image,(QString *)((long)&(pQVar7->d).d + lVar18),
                            (QString *)((long)&pQVar7[1].d.d + lVar18));
            lVar16 = lVar16 + 2;
            lVar18 = lVar18 + 0x30;
          } while (lVar16 < (this->readTexts).d.size + -1);
        }
        png_destroy_read_struct(pppVar1,pppVar2,&this->end_info);
        this->png_ptr = (png_struct *)0x0;
        if (this->row_pointers != (png_byte **)0x0) {
          operator_delete__(this->row_pointers);
        }
        this->row_pointers = (png_byte **)0x0;
        this->state = Ready;
        if (0 < (int)this->colorSpaceState) {
          bVar11 = QColorSpace::isValid(&this->colorSpace);
          if (bVar11) {
            QImage::setColorSpace((QImage *)image,&this->colorSpace);
          }
        }
        goto LAB_005a43e8;
      }
      iVar13 = png_get_PLTE(ppVar5,ppVar6,&uStack_90,&iStack_94);
      if ((iVar13 == 0) || (0x100 < iStack_94)) goto LAB_005a40c9;
      if (iStack_6c != 1) {
        png_set_packing(ppVar5);
      }
      png_read_update_info(ppVar5,ppVar6);
      png_get_IHDR(ppVar5,ppVar6,&RStack_64,&RStack_68,&iStack_6c,&uStack_70,0,0,0);
      iVar13 = iStack_6c;
      size.ht.m_i = RStack_68.m_i;
      size.wd.m_i = RStack_64.m_i;
      bVar11 = QImageIOHandler::allocateImage
                         (size,(uint)(iStack_6c != 1) * 2 + Format_Mono,(QImage *)image);
      if (bVar11) {
        png_get_PLTE(ppVar5,ppVar6,&uStack_90,&iStack_94);
        iVar14 = 2;
        if (iVar13 != 1) {
          iVar14 = iStack_94;
        }
        QImage::setColorCount((QImage *)image,iVar14);
        iVar13 = png_get_tRNS(ppVar5,ppVar6,&QStack_78,&iStack_84,&uStack_80);
        uVar19 = 0;
        if ((iVar13 == 0) || (QStack_78 == (QPoint)0x0)) {
          uVar19 = 0;
        }
        else if (0 < iStack_84) {
          lVar16 = 2;
          uVar19 = 0;
          do {
            QImage::setColor((QImage *)image,(int)uVar19,
                             (uint)*(byte *)((uStack_90 - 1) + lVar16) << 8 |
                             (uint)*(byte *)((uStack_90 - 2) + lVar16) << 0x10 |
                             (uint)*(byte *)(uStack_90 + lVar16) |
                             (uint)*(byte *)((long)QStack_78 + uVar19) << 0x18);
            uVar19 = uVar19 + 1;
            lVar16 = lVar16 + 3;
          } while ((long)uVar19 < (long)iStack_84);
        }
        if ((int)uVar19 < iStack_94) {
          lVar16 = (uVar19 & 0xffffffff) * 3 + 2;
          uVar19 = uVar19 & 0xffffffff;
          do {
            QImage::setColor((QImage *)image,(int)uVar19,
                             (uint)*(byte *)((uStack_90 - 1) + lVar16) << 8 |
                             (uint)*(byte *)((uStack_90 - 2) + lVar16) << 0x10 |
                             (uint)*(byte *)(uStack_90 + lVar16) | 0xff000000);
            uVar12 = (int)uVar19 + 1;
            lVar16 = lVar16 + 3;
            uVar19 = (ulong)uVar12;
          } while ((int)uVar12 < iStack_94);
        }
        png_set_bgr(ppVar5);
        goto LAB_005a4499;
      }
    }
LAB_005a43c4:
    png_destroy_read_struct(pppVar1,&this->info_ptr,&this->end_info);
    this->png_ptr = (png_struct *)0x0;
    if (this->row_pointers != (png_byte **)0x0) {
      operator_delete__(this->row_pointers);
    }
  }
  this->state = Error;
LAB_005a43e8:
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_60) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static
void iod_read_fn(png_structp png_ptr, png_bytep data, png_size_t length)
{
    QPngHandlerPrivate *d = (QPngHandlerPrivate *)png_get_io_ptr(png_ptr);
    QIODevice *in = d->q->device();

    if (d->state == QPngHandlerPrivate::ReadingEnd && !in->isSequential() && in->size() > 0 && (in->size() - in->pos()) < 4 && length == 4) {
        // Workaround for certain malformed PNGs that lack the final crc bytes
        uchar endcrc[4] = { 0xae, 0x42, 0x60, 0x82 };
        memcpy(data, endcrc, 4);
        in->seek(in->size());
        return;
    }

    while (length) {
        int nr = in->read((char*)data, length);
        if (nr <= 0) {
            png_error(png_ptr, "Read Error");
            return;
        }
        length -= nr;
    }
}